

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

char * __thiscall
ctemplate_htmlparser::HtmlparserCppTest::IdToName
          (HtmlparserCppTest *this,IdNameMap *list,int enum_id)

{
  IdNameMap *pIVar1;
  char *pcVar2;
  char **ppcVar3;
  
  if (list == (IdNameMap *)0x0) {
    pcVar2 = "list != NULL";
  }
  else {
    ppcVar3 = &list->name;
    while (pcVar2 = *ppcVar3, pcVar2 != (char *)0x0) {
      pIVar1 = (IdNameMap *)(ppcVar3 + -1);
      ppcVar3 = ppcVar3 + 2;
      if (pIVar1->id == enum_id) {
        return pcVar2;
      }
    }
    pcVar2 = "false";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar2);
  exit(1);
}

Assistant:

const char *HtmlparserCppTest::IdToName(const struct IdNameMap *list,
                                        int enum_id) {
  CHECK(list != NULL);
  while (list->name) {
    if (enum_id == list->id) {
      return list->name;
    }
    list++;
  }
  LOG(FATAL) << "Unknown id";
}